

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSupp.c
# Opt level: O0

int Sim_ComputeSuppRound(Sim_Man_t *p,int fUseTargets)

{
  int iVar1;
  abctime aVar2;
  abctime aVar3;
  abctime clk;
  int Counter;
  int i;
  Vec_Ptr_t *vTargets;
  int fUseTargets_local;
  Sim_Man_t *p_local;
  
  clk._0_4_ = 0;
  aVar2 = Abc_Clock();
  Sim_UtilSimulate(p,0);
  aVar3 = Abc_Clock();
  p->timeSim = (aVar3 - aVar2) + p->timeSim;
  for (clk._4_4_ = p->iInput; clk._4_4_ < p->nInputs; clk._4_4_ = clk._4_4_ + 1) {
    if ((fUseTargets == 0) || (*(int *)((long)p->vSuppTargs->pArray[clk._4_4_] + 4) != 0)) {
      iVar1 = Sim_ComputeSuppRoundNode(p,clk._4_4_,fUseTargets);
      clk._0_4_ = iVar1 + (int)clk;
    }
  }
  return (int)clk;
}

Assistant:

int Sim_ComputeSuppRound( Sim_Man_t * p, int  fUseTargets )
{
    Vec_Ptr_t * vTargets;
    int i, Counter = 0;
    abctime clk;
    // perform one round of random simulation
clk = Abc_Clock();
    Sim_UtilSimulate( p, 0 );
p->timeSim += Abc_Clock() - clk;
    // iterate through the CIs and detect COs that depend on them
    for ( i = p->iInput; i < p->nInputs; i++ )
    {
        vTargets = (Vec_Ptr_t *)p->vSuppTargs->pArray[i];
        if ( fUseTargets && vTargets->nSize == 0 )
            continue;
        Counter += Sim_ComputeSuppRoundNode( p, i, fUseTargets );
    }
    return Counter;
}